

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O3

char * __thiscall cppjieba::PosTagger::SpecialRule(PosTagger *this,RuneStrArray *unicode)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  RuneStr *pRVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = unicode->size_;
  if (1 < uVar2) {
    pRVar5 = unicode->ptr_;
    uVar6 = 1;
    uVar4 = 0;
    uVar7 = 0;
    do {
      uVar1 = pRVar5->rune;
      if ((uVar1 < 0x80) && (uVar4 = uVar4 + 1, 0x2f < uVar1)) {
        uVar7 = uVar7 + (uVar1 < 0x3a);
      }
      if (uVar2 <= uVar6) break;
      uVar6 = uVar6 + 1;
      pRVar5 = pRVar5 + 1;
    } while (uVar4 < uVar2 >> 1);
    pcVar3 = "eng";
    if (uVar7 == uVar4) {
      pcVar3 = "m";
    }
    if (uVar4 != 0) {
      return pcVar3;
    }
  }
  return "x";
}

Assistant:

const char* SpecialRule(const RuneStrArray& unicode) const {
    size_t m = 0;
    size_t eng = 0;
    for (size_t i = 0; i < unicode.size() && eng < unicode.size() / 2; i++) {
      if (unicode[i].rune < 0x80) {
        eng ++;
        if ('0' <= unicode[i].rune && unicode[i].rune <= '9') {
          m++;
        }
      }
    }
    // ascii char is not found
    if (eng == 0) {
      return POS_X;
    }
    // all the ascii is number char
    if (m == eng) {
      return POS_M;
    }
    // the ascii chars contain english letter
    return POS_ENG;
  }